

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::ParsedScene(ParsedScene *this)

{
  _Rb_tree_header *p_Var1;
  FileLoc loc;
  memory_resource *pmVar2;
  undefined1 auVar3 [64];
  ParameterDictionary dict;
  string local_2a8;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_268;
  undefined1 local_260 [32];
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_240;
  ParameterDictionary local_1c0;
  ParameterDictionary local_158;
  ParsedParameterVector local_f0;
  ParsedParameterVector local_90;
  
  (this->super_SceneRepresentation).errorExit = false;
  (this->super_SceneRepresentation)._vptr_SceneRepresentation = (_func_int **)&PTR_Scale_02d42e20;
  (this->film).name._M_dataplus._M_p = (pointer)&(this->film).name.field_2;
  (this->film).name._M_string_length = 0;
  (this->film).name.field_2._M_local_buf[0] = '\0';
  pmVar2 = pstd::pmr::new_delete_resource();
  (this->film).parameters.params.alloc.memoryResource = pmVar2;
  (this->film).parameters.params.ptr = (ParsedParameter **)0x0;
  (this->film).parameters.params.nAlloc = 0;
  (this->film).parameters.params.nStored = 0;
  (this->film).parameters.colorSpace = (RGBColorSpace *)0x0;
  (this->film).loc.filename._M_len = 0;
  (this->film).loc.filename._M_str = (char *)0x0;
  (this->film).loc.line = 1;
  (this->film).loc.column = 0;
  (this->sampler).name._M_dataplus._M_p = (pointer)&(this->sampler).name.field_2;
  (this->sampler).name._M_string_length = 0;
  (this->sampler).name.field_2._M_local_buf[0] = '\0';
  pmVar2 = pstd::pmr::new_delete_resource();
  (this->sampler).parameters.params.alloc.memoryResource = pmVar2;
  (this->sampler).parameters.params.ptr = (ParsedParameter **)0x0;
  (this->sampler).parameters.params.nAlloc = 0;
  (this->sampler).parameters.params.nStored = 0;
  (this->sampler).parameters.colorSpace = (RGBColorSpace *)0x0;
  (this->sampler).loc.filename._M_len = 0;
  (this->sampler).loc.filename._M_str = (char *)0x0;
  (this->sampler).loc.line = 1;
  (this->sampler).loc.column = 0;
  (this->integrator).name._M_dataplus._M_p = (pointer)&(this->integrator).name.field_2;
  (this->integrator).name._M_string_length = 0;
  (this->integrator).name.field_2._M_local_buf[0] = '\0';
  pmVar2 = pstd::pmr::new_delete_resource();
  (this->integrator).parameters.params.alloc.memoryResource = pmVar2;
  (this->integrator).parameters.params.ptr = (ParsedParameter **)0x0;
  (this->integrator).parameters.params.nAlloc = 0;
  (this->integrator).parameters.params.nStored = 0;
  (this->integrator).parameters.colorSpace = (RGBColorSpace *)0x0;
  (this->integrator).loc.filename._M_len = 0;
  (this->integrator).loc.filename._M_str = (char *)0x0;
  (this->integrator).loc.line = 1;
  (this->integrator).loc.column = 0;
  (this->filter).name._M_dataplus._M_p = (pointer)&(this->filter).name.field_2;
  (this->filter).name._M_string_length = 0;
  (this->filter).name.field_2._M_local_buf[0] = '\0';
  pmVar2 = pstd::pmr::new_delete_resource();
  (this->filter).parameters.params.alloc.memoryResource = pmVar2;
  (this->filter).parameters.params.ptr = (ParsedParameter **)0x0;
  (this->filter).parameters.params.nAlloc = 0;
  (this->filter).parameters.params.nStored = 0;
  (this->filter).parameters.colorSpace = (RGBColorSpace *)0x0;
  (this->filter).loc.filename._M_len = 0;
  (this->filter).loc.filename._M_str = (char *)0x0;
  (this->filter).loc.line = 1;
  (this->filter).loc.column = 0;
  (this->accelerator).name._M_dataplus._M_p = (pointer)&(this->accelerator).name.field_2;
  (this->accelerator).name._M_string_length = 0;
  (this->accelerator).name.field_2._M_local_buf[0] = '\0';
  pmVar2 = pstd::pmr::new_delete_resource();
  (this->accelerator).parameters.params.alloc.memoryResource = pmVar2;
  (this->accelerator).parameters.params.ptr = (ParsedParameter **)0x0;
  (this->accelerator).parameters.params.nAlloc = 0;
  (this->accelerator).parameters.params.nStored = 0;
  (this->accelerator).parameters.colorSpace = (RGBColorSpace *)0x0;
  (this->accelerator).loc.filename._M_len = 0;
  (this->accelerator).loc.filename._M_str = (char *)0x0;
  (this->accelerator).loc.line = 1;
  (this->accelerator).loc.column = 0;
  CameraSceneEntity::CameraSceneEntity(&this->camera);
  p_Var1 = &(this->media)._M_t._M_impl.super__Rb_tree_header;
  (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->namedMaterials).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->namedMaterials).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->namedMaterials).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->materials).super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->namedMaterials).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->materials).super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials).super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials).super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  auVar3 = ZEXT464(0) << 0x40;
  *(undefined1 (*) [64])&(this->media)._M_t._M_impl.super__Rb_tree_header._M_node_count = auVar3;
  *(undefined1 (*) [64])
   &(this->lights).
    super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar3;
  *(undefined1 (*) [64])
   &(this->shapes).
    super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar3;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  GraphicsState::GraphicsState(&this->graphicsState);
  this->currentBlock = OptionsBlock;
  p_Var1 = &(this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbrt::Transform::Transform(&this->renderFromWorld);
  TransformCache::TransformCache(&this->transformCache);
  (this->pushStack).
  super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pushStack).
  super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pushStack).
  super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->currentInstance = (InstanceDefinitionSceneEntity *)0x0;
  (this->pushedGraphicsStates).
  super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pushedGraphicsStates).
  super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pushedGraphicsStates).
  super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pushStack).
  super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->camera,0,(char *)(this->camera).super_SceneEntity.name._M_string_length,
             0x2815269);
  std::__cxx11::string::_M_replace
            ((ulong)&this->sampler,0,(char *)(this->sampler).name._M_string_length,0x2815275);
  std::__cxx11::string::_M_replace
            ((ulong)&this->filter,0,(char *)(this->filter).name._M_string_length,0x3f855a);
  std::__cxx11::string::_M_replace
            ((ulong)&this->integrator,0,(char *)(this->integrator).name._M_string_length,0x281527d);
  local_90.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_90.ptr = (ParsedParameter **)0x0;
  local_90.nAlloc = 0;
  local_90.nStored = 0;
  ParameterDictionary::ParameterDictionary(&local_158,&local_90,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_90);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"diffuse","");
  local_268.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_1c0.params,&local_158.params,&local_268);
  local_1c0.colorSpace = local_158.colorSpace;
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 1;
  loc.line = 1;
  loc.column = 0;
  loc.filename = (string_view)ZEXT816(0);
  SceneEntity::SceneEntity((SceneEntity *)local_260,&local_2a8,&local_1c0,loc);
  std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::
  emplace_back<pbrt::SceneEntity>(&this->materials,(SceneEntity *)local_260);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_240);
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_,
                    (ulong)((long)&(((string *)local_260._16_8_)->_M_dataplus)._M_p + 1));
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_1c0.params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->accelerator,0,(char *)(this->accelerator).name._M_string_length,0x2815285
            );
  std::__cxx11::string::_M_replace
            ((ulong)&this->film,0,(char *)(this->film).name._M_string_length,0x40a842);
  local_f0.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_f0.ptr = (ParsedParameter **)0x0;
  local_f0.nAlloc = 0;
  local_f0.nStored = 0;
  ParameterDictionary::ParameterDictionary
            ((ParameterDictionary *)local_260,&local_f0,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&(this->film).parameters.params,
              (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               *)local_260);
  (this->film).parameters.colorSpace = (RGBColorSpace *)local_240.field_2.fixed[6];
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)local_260);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_f0);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_158.params);
  return;
}

Assistant:

ParsedScene::ParsedScene() {
    // Set scene defaults
    camera.name = "perspective";
    sampler.name = "pmj02bn";
    filter.name = "gaussian";
    integrator.name = "volpath";

    ParameterDictionary dict({}, RGBColorSpace::sRGB);
    materials.push_back(SceneEntity("diffuse", dict, {}));
    accelerator.name = "bvh";
    film.name = "rgb";
    film.parameters = ParameterDictionary({}, RGBColorSpace::sRGB);
}